

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

Endpoint * __thiscall
helics::MessageFederateManager::getEndpoint(MessageFederateManager *this,string_view name)

{
  Endpoint *pEVar1;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  shared_handle sharedEpt;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_48,&this->mLocalEndpoints);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_60,local_48.data,name);
  gmlc::containers::StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end
            (&local_30,&(local_48.data)->dataStorage);
  pEVar1 = (Endpoint *)invalidEpt;
  if (local_60.vec != local_30.vec) {
    pEVar1 = local_60.ptr;
  }
  if (local_60.offset != local_30.offset) {
    pEVar1 = local_60.ptr;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_48.m_handle_lock);
  return pEVar1;
}

Assistant:

const Endpoint& MessageFederateManager::getEndpoint(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock_shared();
    auto ept = sharedEpt->find(name);
    return (ept != sharedEpt.end()) ? (*ept) : invalidEpt;
}